

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall
cs::compiler_type::preprocessor::process_endline
          (preprocessor *this,context_t *context,compiler_type *compiler,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,charset *encoding)

{
  string *__lhs;
  size_t sVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  exception *peVar5;
  _Map_pointer ppptVar6;
  char *size;
  deque<char,_std::allocator<char>_> *raw_buff;
  _Elt_pointer pptVar7;
  token_base *ptr;
  token_base *ptVar8;
  _Elt_pointer pptVar9;
  string version_str;
  string arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  deque<char,_std::allocator<char>_> *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0 [4];
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (this->is_annotation == true) {
    this->is_annotation = false;
    new_empty_line(this,context);
    return;
  }
  if (this->is_command == true) {
    this->is_command = false;
    __lhs = &this->command;
    bVar2 = std::operator==(__lhs,"begin");
    if ((bVar2) && (this->multi_line == false)) {
      this->multi_line = true;
    }
    else {
      size = "end";
      bVar2 = std::operator==(__lhs,"end");
      if ((bVar2) && (this->multi_line == true)) {
        arg._M_dataplus._M_p = (pointer)token_base::operator_new((token_base *)0x10,(size_t)size);
        *(size_t *)(arg._M_dataplus._M_p + 8) = this->last_line_num;
        *(undefined ***)arg._M_dataplus._M_p = &PTR__token_base_0023f508;
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::emplace_back<cs::token_base*>
                  ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                   (token_base **)&arg);
        this->multi_line = false;
      }
      else {
        lVar4 = std::__cxx11::string::find((char)__lhs,0x3a);
        arg._M_dataplus._M_p = (pointer)&arg.field_2;
        arg._M_string_length = 0;
        arg.field_2._M_local_buf[0] = '\0';
        if (lVar4 != -1) {
          std::__cxx11::string::substr((ulong)&version_str,(ulong)__lhs);
          std::__cxx11::string::operator=((string *)&arg,(string *)&version_str);
          std::__cxx11::string::~string((string *)&version_str);
          std::__cxx11::string::substr((ulong)&version_str,(ulong)__lhs);
          std::__cxx11::string::operator=((string *)__lhs,(string *)&version_str);
          std::__cxx11::string::~string((string *)&version_str);
        }
        bVar2 = std::operator==(__lhs,"charset");
        if (bVar2) {
          bVar2 = std::operator==(&arg,"ascii");
          if (bVar2) {
            *encoding = ascii;
          }
          else {
            bVar2 = std::operator==(&arg,"utf8");
            if (bVar2) {
              *encoding = utf8;
            }
            else {
              bVar2 = std::operator==(&arg,"gbk");
              if (!bVar2) {
                peVar5 = (exception *)__cxa_allocate_exception(0x90);
                sVar1 = this->line_num;
                std::__cxx11::string::string
                          ((string *)&local_50,
                           (string *)
                           &((context->
                             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->file_path);
                std::operator+(&local_238,"@",__lhs);
                std::operator+(&version_str,&local_238,": ");
                std::operator+(&local_70,&version_str,&arg);
                std::__cxx11::string::string
                          ((string *)&local_90,"Unavailable encoding.",(allocator *)&local_210);
                exception::exception(peVar5,sVar1,&local_50,&local_70,&local_90);
                __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
              }
              *encoding = gbk;
            }
          }
        }
        else {
          bVar2 = std::operator==(__lhs,"require");
          if (!bVar2) {
            peVar5 = (exception *)__cxa_allocate_exception(0x90);
            sVar1 = this->line_num;
            std::__cxx11::string::string
                      ((string *)&local_130,
                       (string *)
                       &((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
                        ._M_ptr)->file_path);
            std::operator+(&version_str,"@",__lhs);
            if (arg._M_string_length == 0) {
              std::__cxx11::string::string((string *)&local_238,"",(allocator *)&local_210);
            }
            else {
              std::operator+(&local_238,": ",&arg);
            }
            std::operator+(&local_150,&version_str,&local_238);
            std::__cxx11::string::string
                      ((string *)&local_170,"Wrong grammar for preprocessor command.",
                       (allocator *)local_1f0);
            exception::exception(peVar5,sVar1,&local_130,&local_150,&local_170);
            __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
          }
          std::__cxx11::string::string((string *)&version_str,"210508",(allocator *)&local_238);
          bVar2 = std::operator>(&arg,&version_str);
          if (bVar2) {
            peVar5 = (exception *)__cxa_allocate_exception(0x90);
            sVar1 = this->line_num;
            std::__cxx11::string::string
                      ((string *)&local_b0,
                       (string *)
                       &((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
                        ._M_ptr)->file_path);
            std::operator+(&local_210,"@",__lhs);
            std::operator+(&local_238,&local_210,": ");
            std::operator+(&local_d0,&local_238,&arg);
            std::operator+(&local_110,"Newer Language Standard required: ",&arg);
            std::operator+(local_1f0,&local_110,", now on ");
            std::operator+(&local_f0,local_1f0,&version_str);
            exception::exception(peVar5,sVar1,&local_b0,&local_d0,&local_f0);
            __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
          }
          std::__cxx11::string::~string((string *)&version_str);
        }
        std::__cxx11::string::~string((string *)&arg);
      }
    }
    (this->command)._M_string_length = 0;
    *(this->command)._M_dataplus._M_p = '\0';
  }
  if (this->empty_buff == true) {
    new_empty_line(this,context);
  }
  else {
    raw_buff = &this->buff;
    local_218 = raw_buff;
    process_char_buff(compiler,raw_buff,tokens,*encoding);
    pptVar9 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppptVar6 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_node;
    for (pptVar7 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
        pptVar7 !=
        (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_start._M_cur; pptVar7 = pptVar7 + -1) {
      if (pptVar7 == pptVar9) {
        ptVar8 = ppptVar6[-1][0x3f];
        if (ptVar8 != (token_base *)0x0) goto LAB_00146f35;
LAB_00146f51:
        pptVar9 = ppptVar6[-1];
        ppptVar6 = ppptVar6 + -1;
        pptVar7 = pptVar9 + 0x40;
      }
      else {
        ptVar8 = pptVar7[-1];
        if (ptVar8 != (token_base *)0x0) {
LAB_00146f35:
          iVar3 = (*ptVar8->_vptr_token_base[2])(ptVar8);
          if (iVar3 == 1) break;
          ptVar8->line_num = this->line_num;
          if (pptVar7 == pptVar9) goto LAB_00146f51;
        }
      }
    }
    if (this->multi_line == false) {
      arg._M_dataplus._M_p = (pointer)token_base::operator_new((token_base *)0x10,(size_t)raw_buff);
      *(size_t *)(arg._M_dataplus._M_p + 8) = this->line_num;
      *(undefined ***)arg._M_dataplus._M_p = &PTR__token_base_0023f508;
      std::deque<cs::token_base*,std::allocator<cs::token_base*>>::emplace_back<cs::token_base*>
                ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                 (token_base **)&arg);
    }
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->file_buff,&this->line);
    sVar1 = this->line_num;
    this->line_num = sVar1 + 1;
    this->last_line_num = sVar1;
    std::deque<char,_std::allocator<char>_>::clear(local_218);
    (this->line)._M_string_length = 0;
    *(this->line)._M_dataplus._M_p = '\0';
    this->empty_buff = true;
    this->empty_line = true;
  }
  return;
}

Assistant:

void process_endline(const context_t &context, compiler_type &compiler, std::deque<token_base *> &tokens,
		                     charset &encoding)
		{
			if (is_annotation) {
				is_annotation = false;
				new_empty_line(context);
				return;
			}
			if (is_command) {
				is_command = false;
				if (command == "begin" && !multi_line)
					multi_line = true;
				else if (command == "end" && multi_line) {
					tokens.push_back(new token_endline(last_line_num));
					multi_line = false;
				}
				else {
					auto pos = command.find(':');
					std::string arg;
					if (pos != std::string::npos) {
						arg = command.substr(pos + 1);
						command = command.substr(0, pos);
					}
					if (command == "charset") {
						if (arg == "ascii")
							encoding = charset::ascii;
						else if (arg == "utf8")
							encoding = charset::utf8;
						else if (arg == "gbk")
							encoding = charset::gbk;
						else
							throw exception(line_num, context->file_path, "@" + command + ": " + arg,
							                "Unavailable encoding.");
					}
					else if (command == "require") {
						std::string version_str = CS_GET_VERSION_STR(COVSCRIPT_STD_VERSION);
						if (arg > version_str)
							throw exception(line_num, context->file_path, "@" + command + ": " + arg,
							                "Newer Language Standard required: " + arg + ", now on " + version_str);
					}
					else
						throw exception(line_num, context->file_path, "@" + command + (arg.empty() ? "" : ": " + arg),
						                "Wrong grammar for preprocessor command.");
				}
				command.clear();
			}
			if (empty_buff) {
				new_empty_line(context);
				return;
			}
			try {
				compiler.process_char_buff(buff, tokens, encoding);
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(line_num, context->file_path, line, e.what());
			}
			for (auto it = tokens.rbegin(); it != tokens.rend(); ++it) {
				if (*it != nullptr) {
					token_base *ptr = *it;
					if (ptr->get_type() == token_types::endline)
						break;
					else
						ptr->line_num = line_num;
				}
			}
			if (!multi_line)
				tokens.push_back(new token_endline(line_num));
			context->file_buff.emplace_back(line);
			last_line_num = line_num++;
			buff.clear();
			line.clear();
			empty_buff = true;
			empty_line = true;
		}